

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::inst::RefInst::display(RefInst *this,ostream *o)

{
  ostream *poVar1;
  add_pointer_t<const_mir::inst::VarId> ptVar2;
  add_pointer_t<const_std::__cxx11::basic_string<char>_> ptVar3;
  ostream *in_RSI;
  Displayable *in_RDI;
  add_pointer_t<const_std::__cxx11::basic_string<char>_> x_1;
  add_pointer_t<const_mir::inst::VarId> x;
  ostream *in_stack_ffffffffffffffe0;
  
  poVar1 = prelude::operator<<(in_stack_ffffffffffffffe0,in_RDI);
  std::operator<<(poVar1," = &");
  ptVar2 = std::get_if<mir::inst::VarId,mir::inst::VarId,std::__cxx11::string>
                     ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2be171);
  if (ptVar2 == (add_pointer_t<const_mir::inst::VarId>)0x0) {
    ptVar3 = std::get_if<std::__cxx11::string,mir::inst::VarId,std::__cxx11::string>
                       ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x2be19c);
    if (ptVar3 != (add_pointer_t<const_std::__cxx11::basic_string<char>_>)0x0) {
      poVar1 = std::operator<<(in_RSI,"@");
      std::operator<<(poVar1,(string *)ptVar3);
    }
  }
  else {
    prelude::operator<<(in_stack_ffffffffffffffe0,in_RDI);
  }
  return;
}

Assistant:

void RefInst::display(std::ostream& o) const {
  o << dest << " = &";
  if (auto x = std::get_if<VarId>(&val)) {
    o << *x;
  } else if (auto x = std::get_if<std::string>(&val)) {
    o << "@" << *x;
  }
}